

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
bssl::InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL>::PushBack
          (InplaceVector<std::vector<int,_std::allocator<int>_>,_4UL> *this,
          vector<int,_std::allocator<int>_> *val)

{
  byte bVar1;
  pointer piVar2;
  char *pcVar3;
  pointer piVar4;
  pointer piVar5;
  
  piVar5 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (val->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = this->size_;
  if ((ulong)bVar1 < 4) {
    pcVar3 = this->storage_ + (ulong)bVar1 * 0x18;
    *(pointer *)pcVar3 = piVar5;
    *(pointer *)(pcVar3 + 8) = piVar2;
    *(pointer *)(pcVar3 + 0x10) = piVar4;
    this->size_ = bVar1 + 1;
    piVar5 = (pointer)0x0;
    piVar4 = (pointer)0x0;
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)piVar4 - (long)piVar5);
  }
  if (pcVar3 != (char *)0x0) {
    return (vector<int,_std::allocator<int>_> *)pcVar3;
  }
  abort();
}

Assistant:

T &PushBack(T val) {
    T *ret = TryPushBack(std::move(val));
    BSSL_CHECK(ret != nullptr);
    return *ret;
  }